

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

string * Potassco::ProgramOptions::quote(string *x)

{
  char *pcVar1;
  string *psVar2;
  string *in_RDI;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"\'",&local_31);
  pcVar1 = (char *)std::__cxx11::string::append(local_30);
  psVar2 = (string *)std::__cxx11::string::append(pcVar1);
  std::__cxx11::string::string((string *)in_RDI,psVar2);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return in_RDI;
}

Assistant:

static std::string quote(const std::string& x) {
	return std::string("'").append(x).append("'");
}